

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.h
# Opt level: O0

size_t __thiscall
std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>::operator()
          (hash<std::tuple<int,_int,_std::bitset<100UL>_>_> *this,
          tuple<int,_int,_std::bitset<100UL>_> *p)

{
  __tuple_element_t<0UL,_tuple<int,_int,_bitset<100UL>_>_> *p_Var1;
  size_t sVar2;
  __tuple_element_t<1UL,_tuple<int,_int,_bitset<100UL>_>_> *p_Var3;
  bitset<100UL> *__b;
  hash<std::bitset<100UL>_> *in_RSI;
  hash<std::bitset<100UL>_> h4;
  hash<int> h1;
  size_t seed;
  hash<int> local_19;
  ulong uVar4;
  
  uVar4 = 0;
  p_Var1 = get<0ul,int,int,std::bitset<100ul>>((tuple<int,_int,_std::bitset<100UL>_> *)0x31da51);
  sVar2 = hash<int>::operator()(&local_19,*p_Var1);
  uVar4 = sVar2 + 0x9e3779b9 + uVar4 * 0x40 + (uVar4 >> 2) ^ uVar4;
  p_Var3 = get<1ul,int,int,std::bitset<100ul>>((tuple<int,_int,_std::bitset<100UL>_> *)0x31da96);
  sVar2 = hash<int>::operator()(&local_19,*p_Var3);
  __b = (bitset<100UL> *)(sVar2 + 0x9e3779b9 + uVar4 * 0x40 + (uVar4 >> 2) ^ uVar4);
  get<2ul,int,int,std::bitset<100ul>>((tuple<int,_int,_std::bitset<100UL>_> *)0x31dadb);
  sVar2 = hash<std::bitset<100UL>_>::operator()(in_RSI,__b);
  return sVar2 + 0x9e3779b9 + (long)__b * 0x40 + ((ulong)__b >> 2) ^ (ulong)__b;
}

Assistant:

HOT inline size_t operator()(const tuple<int,int,var_bitset>& p) const
	{
            size_t seed = 0;
            hash<int> h1;
            seed ^= h1(std::get<0>(p)) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
            seed ^= h1(std::get<1>(p)) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
            hash<var_bitset> h4;
            seed ^= h4(std::get<2>(p)) + 0x9e3779b9 + (seed << 6) + (seed >> 2);
            return seed;
	}